

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FreeCamera.cpp
# Opt level: O1

void __thiscall fw::FreeCamera::moveRelatively(FreeCamera *this,vec3 *movement)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  undefined8 uVar5;
  vec3 vVar6;
  vec3 vVar7;
  
  fVar1 = (movement->field_0).field_0.z;
  vVar6 = getWorldForwardDirection(this);
  fVar2 = (movement->field_0).field_0.x;
  fVar3 = (movement->field_0).field_0.y;
  uVar5 = *(undefined8 *)&(this->_upDirection).field_0;
  fVar4 = (this->_upDirection).field_0.field_0.z;
  vVar7 = getWorldRightDirection(this);
  (this->_worldPosition).field_0.field_0.x =
       fVar2 * vVar7.field_0._0_4_ + fVar3 * (float)uVar5 + fVar1 * vVar6.field_0._0_4_ +
       (this->_worldPosition).field_0.field_0.x;
  (this->_worldPosition).field_0.field_0.y =
       vVar7.field_0._4_4_ * fVar2 +
       (float)((ulong)uVar5 >> 0x20) * fVar3 + vVar6.field_0._4_4_ * fVar1 +
       (this->_worldPosition).field_0.field_0.y;
  (this->_worldPosition).field_0.field_0.z =
       vVar7.field_0._8_4_ * fVar2 + fVar3 * fVar4 + vVar6.field_0._8_4_ * fVar1 +
       (this->_worldPosition).field_0.field_0.z;
  return;
}

Assistant:

void FreeCamera::moveRelatively(const glm::vec3& movement)
{
    auto relativeMovement =
        movement.z * getWorldForwardDirection()
        + movement.y * getWorldUpDirection()
        + movement.x * getWorldRightDirection();

    _worldPosition += relativeMovement;
}